

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

ssize_t __thiscall parser::state::read(state *this,int __fd,void *__buf,size_t __nbytes)

{
  stream_type *psVar1;
  long lVar2;
  size_type sVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  deque<char,_std::allocator<char>_> *apdStack_d0 [3];
  state *local_b8;
  ind local_b0;
  _Deque_iterator<char,_char_&,_char_*> local_88;
  _Deque_iterator<char,char_const&,char_const*> local_68 [32];
  long local_48;
  ulong local_40;
  ind i;
  ind i_max;
  ind r;
  unsigned_long __vla_expr0;
  ind local_18;
  ind n_local;
  state *this_local;
  
  r = CONCAT44(in_register_00000034,__fd);
  __vla_expr0 = (unsigned_long)(apdStack_d0 + 1);
  lVar2 = -(r + 0xf & 0xfffffffffffffff0);
  puVar4 = (undefined8 *)((long)apdStack_d0 + lVar2 + 8U);
  psVar1 = this->in;
  apdStack_d0[2] = (deque<char,_std::allocator<char>_> *)puVar4;
  local_b8 = this;
  local_18 = r;
  n_local = (ind)this;
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a9658;
  std::istream::read((char *)psVar1,(long)puVar4);
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a966b;
  i_max = std::istream::gcount();
  local_b0 = (local_b8->off).i;
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a968a;
  sVar3 = std::deque<char,_std::allocator<char>_>::size
                    (*(deque<char,_std::allocator<char>_> **)((long)apdStack_d0 + lVar2));
  i = local_b0 + sVar3;
  for (local_40 = 0; local_40 < i_max; local_40 = local_40 + 1) {
    if (*(char *)((long)apdStack_d0[2] + local_40) == '\n') {
      local_48 = i + local_40 + 1;
      *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a96e8;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (*(deque<unsigned_long,_std::allocator<unsigned_long>_> **)
                  ((long)apdStack_d0 + lVar2 + 0x10U),(value_type_conflict1 *)*puVar4);
    }
  }
  apdStack_d0[1] = &local_b8->str;
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a971a;
  std::deque<char,_std::allocator<char>_>::end((deque<char,_std::allocator<char>_> *)*puVar4);
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a9727;
  std::_Deque_iterator<char,char_const&,char_const*>::
  _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>(local_68,&local_88);
  *(undefined8 *)((long)apdStack_d0 + lVar2) = 0x1a974c;
  std::deque<char,std::allocator<char>>::insert<char*,void>
            (*(deque<char,_std::allocator<char>_> **)((long)&local_18 + lVar2),
             *(const_iterator **)((long)&__vla_expr0 + lVar2),*(char **)((long)&r + lVar2),
             *(char **)((long)&i_max + lVar2));
  return i_max;
}

Assistant:

ind read(ind n) {
			value_type s[n];
			// Read into buffer
			in.read(s, n);
			// Count read characters
			ind r = in.gcount();
			// Track newlines
			ind i_max = off.i + str.size();
			for (ind i = 0; i < r; ++i) {
				if ( s[i] == '\n' ) { lines.push_back(i_max + i + 1); }
			}
			// Add to stored input
			str.insert(str.end(), s, s+r);
			return r;
		}